

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O1

CURLcode pop3_perform_auth(Curl_easy *data,char *mech,bufref *initresp)

{
  CURLcode CVar1;
  uchar *puVar2;
  anon_union_280_8_fcbf97e8_for_proto *pp;
  
  pp = &data->conn->proto;
  puVar2 = Curl_bufref_ptr(initresp);
  if (puVar2 != (uchar *)0x0) {
    CVar1 = Curl_pp_sendf(data,&(pp->ftpc).pp,"AUTH %s %s",mech,puVar2);
    return CVar1;
  }
  CVar1 = Curl_pp_sendf(data,&(pp->ftpc).pp,"AUTH %s",mech);
  return CVar1;
}

Assistant:

static CURLcode pop3_perform_auth(struct Curl_easy *data,
                                  const char *mech,
                                  const struct bufref *initresp)
{
  CURLcode result = CURLE_OK;
  struct pop3_conn *pop3c = &data->conn->proto.pop3c;
  const char *ir = (const char *) Curl_bufref_ptr(initresp);

  if(ir) {                                  /* AUTH <mech> ...<crlf> */
    /* Send the AUTH command with the initial response */
    result = Curl_pp_sendf(data, &pop3c->pp, "AUTH %s %s", mech, ir);
  }
  else {
    /* Send the AUTH command */
    result = Curl_pp_sendf(data, &pop3c->pp, "AUTH %s", mech);
  }

  return result;
}